

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O0

void * Abc_NodeGetCuts(void *p,Abc_Obj_t *pObj,int fDag,int fTree)

{
  int iVar1;
  uint uVar2;
  int Node0;
  int Node1;
  int fCompl0;
  int fCompl1;
  Abc_Obj_t *pAVar3;
  Cut_Params_t *pCVar4;
  Vec_Int_t *p_00;
  Cut_Cut_t *pCVar5;
  bool bVar6;
  byte local_4c;
  byte local_4b;
  byte local_4a;
  Vec_Int_t *vNodeAttrs;
  Cut_Params_t *pParams;
  uint local_30;
  int TreeCode;
  int fTriv;
  int fDagNode;
  Abc_Obj_t *pFanin;
  int fTree_local;
  int fDag_local;
  Abc_Obj_t *pObj_local;
  void *p_local;
  
  pParams._4_4_ = 0;
  iVar1 = Abc_ObjFaninNum(pObj);
  if (iVar1 == 2) {
    iVar1 = Abc_ObjFanoutNum(pObj);
    bVar6 = false;
    if (1 < iVar1) {
      iVar1 = Abc_NodeIsMuxControlType(pObj);
      bVar6 = iVar1 == 0;
    }
    if (bVar6) {
      Cut_ManIncrementDagNodes((Cut_Man_t *)p);
    }
    local_4a = 1;
    if (!bVar6) {
      local_4a = fDag != 0 ^ 0xff;
    }
    if (fTree != 0) {
      pAVar3 = Abc_ObjFanin0(pObj);
      iVar1 = Abc_ObjFanoutNum(pAVar3);
      local_4b = 0;
      if (1 < iVar1) {
        iVar1 = Abc_NodeIsMuxControlType(pAVar3);
        local_4b = iVar1 != 0 ^ 0xff;
      }
      pAVar3 = Abc_ObjFanin1(pObj);
      iVar1 = Abc_ObjFanoutNum(pAVar3);
      local_4c = 0;
      if (1 < iVar1) {
        iVar1 = Abc_NodeIsMuxControlType(pAVar3);
        local_4c = iVar1 != 0 ^ 0xff;
      }
      pParams._4_4_ = (uint)(local_4c & 1) << 1 | (uint)(local_4b & 1);
    }
    pCVar4 = Cut_ManReadParams((Cut_Man_t *)p);
    if (pCVar4->fLocal != 0) {
      p_00 = Cut_ManReadNodeAttrs((Cut_Man_t *)p);
      iVar1 = Vec_IntEntry(p_00,pObj->Id);
      if (iVar1 != 0) {
        Cut_ManIncrementDagNodes((Cut_Man_t *)p);
      }
      iVar1 = Vec_IntEntry(p_00,pObj->Id);
      local_4a = iVar1 != 0 ^ 0xff;
      pAVar3 = Abc_ObjFanin0(pObj);
      uVar2 = Vec_IntEntry(p_00,pAVar3->Id);
      pAVar3 = Abc_ObjFanin1(pObj);
      iVar1 = Vec_IntEntry(p_00,pAVar3->Id);
      pParams._4_4_ = iVar1 << 1 | uVar2;
    }
    local_30 = (uint)(local_4a & 1);
    iVar1 = pObj->Id;
    Node0 = Abc_ObjFaninId0(pObj);
    Node1 = Abc_ObjFaninId1(pObj);
    fCompl0 = Abc_ObjFaninC0(pObj);
    fCompl1 = Abc_ObjFaninC1(pObj);
    pCVar5 = Cut_NodeComputeCuts((Cut_Man_t *)p,iVar1,Node0,Node1,fCompl0,fCompl1,local_30,
                                 pParams._4_4_);
    return pCVar5;
  }
  __assert_fail("Abc_ObjFaninNum(pObj) == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcCut.c"
                ,0x1b6,"void *Abc_NodeGetCuts(void *, Abc_Obj_t *, int, int)");
}

Assistant:

void * Abc_NodeGetCuts( void * p, Abc_Obj_t * pObj, int fDag, int fTree )
{
    Abc_Obj_t * pFanin;
    int fDagNode, fTriv, TreeCode = 0;
//    assert( Abc_NtkIsStrash(pObj->pNtk) );
    assert( Abc_ObjFaninNum(pObj) == 2 );

    // check if the node is a DAG node
    fDagNode = (Abc_ObjFanoutNum(pObj) > 1 && !Abc_NodeIsMuxControlType(pObj));
    // increment the counter of DAG nodes
    if ( fDagNode ) Cut_ManIncrementDagNodes( (Cut_Man_t *)p );
    // add the trivial cut if the node is a DAG node, or if we compute all cuts
    fTriv = fDagNode || !fDag;
    // check if fanins are DAG nodes
    if ( fTree )
    {
        pFanin = Abc_ObjFanin0(pObj);
        TreeCode |=  (Abc_ObjFanoutNum(pFanin) > 1 && !Abc_NodeIsMuxControlType(pFanin));
        pFanin = Abc_ObjFanin1(pObj);
        TreeCode |= ((Abc_ObjFanoutNum(pFanin) > 1 && !Abc_NodeIsMuxControlType(pFanin)) << 1);
    }

    // changes due to the global/local cut computation
    {
        Cut_Params_t * pParams = Cut_ManReadParams((Cut_Man_t *)p);
        if ( pParams->fLocal )
        {
            Vec_Int_t * vNodeAttrs = Cut_ManReadNodeAttrs((Cut_Man_t *)p);
            fDagNode = Vec_IntEntry( vNodeAttrs, pObj->Id );
            if ( fDagNode ) Cut_ManIncrementDagNodes( (Cut_Man_t *)p );
//            fTriv = fDagNode || !pParams->fGlobal;
            fTriv = !Vec_IntEntry( vNodeAttrs, pObj->Id );
            TreeCode = 0;
            pFanin = Abc_ObjFanin0(pObj);
            TreeCode |=  Vec_IntEntry( vNodeAttrs, pFanin->Id );
            pFanin = Abc_ObjFanin1(pObj);
            TreeCode |= (Vec_IntEntry( vNodeAttrs, pFanin->Id ) << 1);
        }
    }
    return Cut_NodeComputeCuts( (Cut_Man_t *)p, pObj->Id, Abc_ObjFaninId0(pObj), Abc_ObjFaninId1(pObj),  
        Abc_ObjFaninC0(pObj), Abc_ObjFaninC1(pObj), fTriv, TreeCode );  
}